

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalNinjaGenerator.cxx
# Opt level: O3

void __thiscall
cmGlobalNinjaGenerator::StripNinjaOutputPathPrefixAsSuffix
          (cmGlobalNinjaGenerator *this,string *path)

{
  ulong __n1;
  int iVar1;
  basic_string_view<char,_std::char_traits<char>_> __str;
  basic_string_view<char,_std::char_traits<char>_> local_20;
  
  local_20._M_len = path->_M_string_length;
  if (local_20._M_len != 0) {
    local_20._M_str = (path->_M_dataplus)._M_p;
    if (local_20._M_str[local_20._M_len - 1] != '/') {
      std::__cxx11::string::push_back((char)path);
      local_20._M_str = (path->_M_dataplus)._M_p;
      local_20._M_len = path->_M_string_length;
    }
    __n1 = (this->OutputPathPrefix)._M_string_length;
    if (__n1 <= local_20._M_len) {
      __str._M_str = (this->OutputPathPrefix)._M_dataplus._M_p;
      __str._M_len = __n1;
      iVar1 = std::basic_string_view<char,_std::char_traits<char>_>::compare
                        (&local_20,local_20._M_len - __n1,__n1,__str);
      if (iVar1 == 0) {
        std::__cxx11::string::resize((ulong)path,(char)path->_M_string_length - (char)__n1);
      }
    }
  }
  return;
}

Assistant:

void cmGlobalNinjaGenerator::StripNinjaOutputPathPrefixAsSuffix(
  std::string& path)
{
  if (path.empty()) {
    return;
  }
  EnsureTrailingSlash(path);
  cmStripSuffixIfExists(path, this->OutputPathPrefix);
}